

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

bool __thiscall Spi::writeBin(Spi *this,string *filename)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  size_t sVar6;
  int local_18c;
  duration<long,_std::ratio<1L,_1000L>_> local_188;
  int local_17c;
  uint8_t local_178 [4];
  int page_size;
  uint8_t buffer_1 [256];
  int local_70;
  int addr_1;
  int rc_1;
  int addr;
  int end_addr;
  int begin_addr;
  size_t local_50;
  size_t wc;
  size_t rc;
  FILE *pipe;
  long file_size;
  FILE *f;
  string *psStack_20;
  int rw_offset;
  string *filename_local;
  Spi *this_local;
  
  f._4_4_ = 0;
  file_size = 0;
  pipe = (FILE *)0xffffffffffffffff;
  psStack_20 = filename;
  filename_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  file_size = (long)fopen(pcVar3,"rb");
  pFVar1 = _stderr;
  if ((FILE *)file_size == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Can\'t open \'%s\' for reading: ",uVar4);
    return false;
  }
  iVar2 = fseek((FILE *)file_size,0,2);
  if (iVar2 == -1) {
    rc = file_size;
    file_size = (long)tmpfile();
    if ((FILE *)file_size == (FILE *)0x0) {
      fprintf(_stderr,"can\'t open temporary file\n");
      return false;
    }
    pipe = (FILE *)0x0;
    while (wc = fread(writeBin::buffer,1,0x1000,(FILE *)rc), wc != 0) {
      local_50 = fwrite(writeBin::buffer,1,wc,(FILE *)file_size);
      if (local_50 != wc) {
        fprintf(_stderr,"can\'t write to temporary file\n");
        return false;
      }
      pipe = pipe + wc;
    }
    fclose((FILE *)rc);
    fseek((FILE *)file_size,0,0);
  }
  else {
    pipe = (FILE *)ftell((FILE *)file_size);
    pFVar1 = _stderr;
    if (pipe == (FILE *)0xffffffffffffffff) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s: ftell: ",uVar4);
      return false;
    }
    iVar2 = fseek((FILE *)file_size,0,0);
    pFVar1 = _stderr;
    if (iVar2 == -1) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s: fseek: ",uVar4);
      return false;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Resetting...");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  flash_chip_deselect(this);
  end_addr = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&begin_addr,&end_addr);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&begin_addr);
  poVar5 = std::operator<<((ostream *)&std::cout,"cdone: ");
  iVar2 = get_cdone(this);
  pcVar3 = "low";
  if (iVar2 != 0) {
    pcVar3 = "high";
  }
  poVar5 = std::operator<<(poVar5,pcVar3);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  flash_reset(this);
  flash_power_up(this);
  flash_read_id(this);
  iVar2 = f._4_4_ + (int)pipe;
  for (addr_1 = f._4_4_ & 0xffff0000; addr_1 < (int)(iVar2 + 0xffffU & 0xffff0000);
      addr_1 = addr_1 + 0x10000) {
    flash_write_enable(this);
    flash_64kB_sector_erase(this,addr_1);
    if ((this->verbose & 1U) != 0) {
      fprintf(_stderr,"Status after block erase:\n");
      flash_read_status(this);
    }
    flash_wait(this);
  }
  std::operator<<((ostream *)&std::cout,"Programming... ");
  local_70 = 0;
  while( true ) {
    local_17c = 0x100 - (int)(f._4_4_ + local_70) % 0x100;
    sVar6 = fread(local_178,1,(long)local_17c,(FILE *)file_size);
    iVar2 = (int)sVar6;
    if (iVar2 < 1) break;
    flash_write_enable(this);
    flash_prog(this,f._4_4_ + local_70,local_178,iVar2);
    flash_wait(this);
    local_70 = iVar2 + local_70;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Done.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  fseek((FILE *)file_size,0,0);
  flash_power_down(this);
  set_gpio(this,1,1);
  local_18c = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_188,&local_18c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_188);
  poVar5 = std::operator<<((ostream *)&std::cout,"cdone: ");
  iVar2 = get_cdone(this);
  pcVar3 = "low";
  if (iVar2 != 0) {
    pcVar3 = "high";
  }
  poVar5 = std::operator<<(poVar5,pcVar3);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Done.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (((file_size != 0) && (file_size != _stdin)) && (file_size != _stdout)) {
    fclose((FILE *)file_size);
  }
  return true;
}

Assistant:

bool Spi::writeBin(string filename) {
	int rw_offset = 0;

	FILE *f = NULL;
	long file_size = -1;

	f = fopen(filename.c_str(), "rb");

	if (f == NULL) {
		fprintf(stderr, "Can't open '%s' for reading: ", filename.c_str());
		return false;
	}

	if (fseek(f, 0L, SEEK_END) != -1) {
		file_size = ftell(f);
		if (file_size == -1) {
			fprintf(stderr, "%s: ftell: ", filename.c_str());
			return false;
		}
		if (fseek(f, 0L, SEEK_SET) == -1) {
			fprintf(stderr, "%s: fseek: ", filename.c_str());
			return false;
		}
	} else {
		FILE *pipe = f;

		f = tmpfile();
		if (f == NULL) {
			fprintf(stderr, "can't open temporary file\n");
			return false;
		}
		file_size = 0;

		while (true) {
			static unsigned char buffer[4096];
			size_t rc = fread(buffer, 1, 4096, pipe);
			if (rc <= 0)
				break;
			size_t wc = fwrite(buffer, 1, rc, f);
			if (wc != rc) {
				fprintf(stderr, "can't write to temporary file\n");
				return false;
			}
			file_size += rc;
		}
		fclose(pipe);

		/* now seek to the beginning so we can
		 start reading again */
		fseek(f, 0, SEEK_SET);
	}

	cout << "Resetting..." << endl;

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;

	flash_reset();
	flash_power_up();

	flash_read_id();

	int begin_addr = rw_offset & ~0xffff;
	int end_addr = (rw_offset + file_size + 0xffff) & ~0xffff;

	for (int addr = begin_addr; addr < end_addr; addr += 0x10000) {
		flash_write_enable();
		flash_64kB_sector_erase(addr);
		if (verbose) {
			fprintf(stderr, "Status after block erase:\n");
			flash_read_status();
		}
		flash_wait();
	}

	cout << "Programming... ";

	for (int rc, addr = 0; true; addr += rc) {
		uint8_t buffer[256];
		int page_size = 256 - (rw_offset + addr) % 256;
		rc = fread(buffer, 1, page_size, f);
		if (rc <= 0)
			break;
		flash_write_enable();
		flash_prog(rw_offset + addr, buffer, rc);
		flash_wait();
	}

	cout << "Done." << endl;

	/* seek to the beginning for second pass */
	fseek(f, 0, SEEK_SET);

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;
	cout << "Done." << endl;

	if (f != NULL && f != stdin && f != stdout)
		fclose(f);
	return true;
}